

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdGetConfidentialValueHex
              (void *handle,int64_t value_satoshi,bool ignore_version_info,char **value_hex)

{
  char *pcVar1;
  CfdException *this;
  ConfidentialValue value;
  string hex_str;
  Amount amount;
  ConfidentialValue local_a8;
  string local_80;
  Amount local_60;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  cfd::Initialize();
  if (value_hex != (char **)0x0) {
    cfd::core::Amount::Amount(&local_60,value_satoshi);
    cfd::core::ConfidentialValue::ConfidentialValue(&local_a8,&local_60);
    cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_80,&local_a8);
    if (ignore_version_info) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&local_80);
      std::__cxx11::string::operator=((string *)&local_80,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    pcVar1 = cfd::capi::CreateString(&local_80);
    *value_hex = pcVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    local_a8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
    if ((void *)CONCAT44(local_a8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_a8.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_a8.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_a8.data_.data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    return 0;
  }
  local_a8._vptr_ConfidentialValue = (_func_int **)0x5e1cf2;
  local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8c2;
  local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "CfdGetConfidentialValueHex";
  cfd::core::logger::log<>((CfdSourceLocation *)&local_a8,kCfdLogLevelWarning,"value_hex is null.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_a8._vptr_ConfidentialValue =
       (_func_int **)
       ((long)&local_a8.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"Failed to parameter. value_hex is null.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&local_a8);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialValueHex(
    void* handle, int64_t value_satoshi, bool ignore_version_info,
    char** value_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (value_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "value_hex is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. value_hex is null.");
    }
    Amount amount(value_satoshi);
    ConfidentialValue value(amount);
    std::string hex_str = value.GetHex();

    if (ignore_version_info) {  // erase first 1byte (2 char)
      hex_str = hex_str.substr(2);
    }
    *value_hex = CreateString(hex_str);

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}